

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeWorkList
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  bool bVar1;
  uint32_t ptrId;
  Instruction *pIVar2;
  uint32_t local_5c;
  uint32_t target_addr_id;
  uint32_t var_id_1;
  uint32_t var_id;
  Op op;
  undefined1 local_48 [8];
  iterator ii;
  BasicBlock **bi;
  iterator __end2;
  iterator __begin2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *structured_order_local;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  pIVar2 = opt::Function::DefInst(func);
  AddToWorklist(this,pIVar2);
  MarkFunctionParameterAsLive(this,func);
  MarkFirstBlockAsLive(this,func);
  __end2 = std::__cxx11::
           list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                     (structured_order);
  bi = (BasicBlock **)
       std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ::end(structured_order);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&bi), bVar1) {
    ii.super_iterator.node_ =
         (iterator)std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end2);
    BasicBlock::begin((BasicBlock *)local_48);
    while( true ) {
      BasicBlock::end((BasicBlock *)&var_id);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_48,
                                (iterator_template<spvtools::opt::Instruction> *)&var_id);
      if (!bVar1) break;
      pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      var_id_1 = opt::Instruction::opcode(pIVar2);
      pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      bVar1 = opt::Instruction::IsBranch(pIVar2);
      if (!bVar1) {
        if (var_id_1 == 0x3e) {
          target_addr_id = 0;
          pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_48);
          MemPass::GetPtr(&this->super_MemPass,pIVar2,&target_addr_id);
          bVar1 = IsLocalVar(this,target_addr_id,func);
          if (!bVar1) {
            pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_48);
            AddToWorklist(this,pIVar2);
          }
        }
        else if (var_id_1 - 0x3f < 2) {
          local_5c = 0;
          pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_48);
          ptrId = opt::Instruction::GetSingleWordInOperand(pIVar2,0);
          MemPass::GetPtr(&this->super_MemPass,ptrId,&local_5c);
          bVar1 = IsLocalVar(this,local_5c,func);
          if (!bVar1) {
            pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_48);
            AddToWorklist(this,pIVar2);
          }
        }
        else if ((1 < var_id_1 - 0xf6) && (var_id_1 != 0xff)) {
          pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_48);
          bVar1 = opt::Instruction::IsOpcodeSafeToDelete(pIVar2);
          if (!bVar1) {
            pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_48);
            AddToWorklist(this,pIVar2);
          }
        }
      }
      InstructionList::iterator::operator++((iterator *)local_48);
    }
    std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end2);
  }
  return;
}

Assistant:

void AggressiveDCEPass::InitializeWorkList(
    Function* func, std::list<BasicBlock*>& structured_order) {
  AddToWorklist(&func->DefInst());
  MarkFunctionParameterAsLive(func);
  MarkFirstBlockAsLive(func);

  // Add instructions with external side effects to the worklist. Also add
  // branches that are not attached to a structured construct.
  // TODO(s-perron): The handling of branch seems to be adhoc.  This needs to be
  // cleaned up.
  for (auto& bi : structured_order) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      spv::Op op = ii->opcode();
      if (ii->IsBranch()) {
        continue;
      }
      switch (op) {
        case spv::Op::OpStore: {
          uint32_t var_id = 0;
          (void)GetPtr(&*ii, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpCopyMemory:
        case spv::Op::OpCopyMemorySized: {
          uint32_t var_id = 0;
          uint32_t target_addr_id =
              ii->GetSingleWordInOperand(kCopyMemoryTargetAddrInIdx);
          (void)GetPtr(target_addr_id, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpLoopMerge:
        case spv::Op::OpSelectionMerge:
        case spv::Op::OpUnreachable:
          break;
        default: {
          // Function calls, atomics, function params, function returns, etc.
          if (!ii->IsOpcodeSafeToDelete()) {
            AddToWorklist(&*ii);
          }
        } break;
      }
    }
  }
}